

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcIvy.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkIvySat(Abc_Ntk_t *pNtk,int nConfLimit,int fVerbose)

{
  Ivy_Man_t *pManAig;
  Ivy_Man_t *pMan_00;
  Ivy_Man_t *pTemp;
  Ivy_Man_t *pMan;
  Abc_Ntk_t *pNtkAig;
  Ivy_FraigParams_t *pParams;
  Ivy_FraigParams_t Params;
  int fVerbose_local;
  int nConfLimit_local;
  Abc_Ntk_t *pNtk_local;
  
  Params.nBTLimitMiter = fVerbose;
  Params._60_4_ = nConfLimit;
  pManAig = Abc_NtkIvyBefore(pNtk,0,0);
  if (pManAig == (Ivy_Man_t *)0x0) {
    pNtk_local = (Abc_Ntk_t *)0x0;
  }
  else {
    Ivy_FraigParamsDefault((Ivy_FraigParams_t *)&pParams);
    Params.fDoSparse = Params._60_4_;
    Params.dActConeBumpMax._4_4_ = Params.nBTLimitMiter;
    pMan_00 = Ivy_FraigMiter(pManAig,(Ivy_FraigParams_t *)&pParams);
    Ivy_ManStop(pManAig);
    pNtk_local = Abc_NtkIvyAfter(pNtk,pMan_00,0,0);
    Ivy_ManStop(pMan_00);
  }
  return pNtk_local;
}

Assistant:

Abc_Ntk_t * Abc_NtkIvySat( Abc_Ntk_t * pNtk, int nConfLimit, int fVerbose )
{
    Ivy_FraigParams_t Params, * pParams = &Params; 
    Abc_Ntk_t * pNtkAig;
    Ivy_Man_t * pMan, * pTemp;
    pMan = Abc_NtkIvyBefore( pNtk, 0, 0 );
    if ( pMan == NULL )
        return NULL;
    Ivy_FraigParamsDefault( pParams );
    pParams->nBTLimitMiter = nConfLimit;
    pParams->fVerbose = fVerbose;
//    pMan = Ivy_FraigPerform( pTemp = pMan, pParams );
    pMan = Ivy_FraigMiter( pTemp = pMan, pParams );
    Ivy_ManStop( pTemp );
    pNtkAig = Abc_NtkIvyAfter( pNtk, pMan, 0, 0 );
    Ivy_ManStop( pMan );
    return pNtkAig;
}